

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int aux_close(lua_State *L)

{
  code *pcVar1;
  int iVar2;
  void *pvVar3;
  lua_CFunction cf;
  LStream *p;
  lua_State *L_local;
  
  pvVar3 = luaL_checkudata(L,1,"FILE*");
  pcVar1 = *(code **)((long)pvVar3 + 8);
  *(undefined8 *)((long)pvVar3 + 8) = 0;
  iVar2 = (*pcVar1)(L);
  return iVar2;
}

Assistant:

static int aux_close (lua_State *L) {
  LStream *p = tolstream(L);
  volatile lua_CFunction cf = p->closef;
  p->closef = NULL;  /* mark stream as closed */
  return (*cf)(L);  /* close it */
}